

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp
# Opt level: O2

void __thiscall
gl4cts::DirectStateAccess::Renderbuffers::GetParameterErrorsTest::Clean
          (GetParameterErrorsTest *this)

{
  int iVar1;
  int iVar2;
  undefined4 extraout_var;
  
  iVar1 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  if (this->m_rbo_valid != 0) {
    (**(code **)(CONCAT44(extraout_var,iVar1) + 0x460))(1,&this->m_rbo_valid);
  }
  this->m_rbo_valid = 0;
  this->m_rbo_invalid = 0;
  do {
    iVar2 = (**(code **)(CONCAT44(extraout_var,iVar1) + 0x800))();
  } while (iVar2 != 0);
  return;
}

Assistant:

void GetParameterErrorsTest::Clean()
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Release GL objects. */
	if (m_rbo_valid)
	{
		gl.deleteRenderbuffers(1, &m_rbo_valid);
		m_rbo_valid = 0;
	}

	/* Set initial values - all test shall have the same environment. */
	m_rbo_valid   = 0;
	m_rbo_invalid = 0;

	/* Errors clean up. */
	while (gl.getError())
		;
}